

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O3

size_t duckdb_je_sz_psz_quantize_ceil(size_t size)

{
  size_t sVar1;
  undefined8 local_10;
  
  sVar1 = duckdb_je_sz_psz_quantize_floor(size);
  if (sVar1 < size) {
    duckdb_je_sz_psz_quantize_ceil_cold_1();
    sVar1 = local_10;
  }
  return sVar1;
}

Assistant:

size_t
sz_psz_quantize_ceil(size_t size) {
	size_t ret;

	assert(size > 0);
	assert(size - sz_large_pad <= SC_LARGE_MAXCLASS);
	assert((size & PAGE_MASK) == 0);

	ret = sz_psz_quantize_floor(size);
	if (ret < size) {
		/*
		 * Skip a quantization that may have an adequately large extent,
		 * because under-sized extents may be mixed in.  This only
		 * happens when an unusual size is requested, i.e. for aligned
		 * allocation, and is just one of several places where linear
		 * search would potentially find sufficiently aligned available
		 * memory somewhere lower.
		 */
		ret = sz_pind2sz(sz_psz2ind(ret - sz_large_pad + 1)) +
		    sz_large_pad;
	}
	return ret;
}